

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void sarimatest(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *inp;
  long lVar2;
  sarima_object obj;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dStack_25c8;
  double temp [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  if (__stream != (FILE *)0x0) {
    uVar4 = 0;
    lVar3 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",(long)temp + (uVar4 - 8));
      lVar3 = lVar3 + 1;
      uVar4 = uVar4 + 8;
    }
    inp = (double *)malloc(uVar4 & 0x7fffffff8);
    for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
      inp[lVar2] = temp[lVar2 + -1];
    }
    obj = sarima_init(0,1,1,0xc,0,1,1,(int)lVar3);
    sarima_setMethod(obj,1);
    sarima_setCSSML(obj,0);
    sarima_exec(obj,inp);
    sarima_summary(obj);
    sarima_predict(obj,inp,5,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      printf("%g ",xpred[lVar3]);
    }
    putchar(10);
    printf("Standard Errors  : ");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      dVar5 = amse[lVar3];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      printf("%g ",dVar5);
    }
    putchar(10);
    sarima_free(obj);
    free(inp);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void sarimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *phi, *theta;
	double *PHI, *THETA;
	double *xpred, *amse;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 1;
	Q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
	PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	//ifp = fopen("../data/itdaily.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = sarima_init(p, d, q,s,P,D,Q, N);
	sarima_setMethod(obj, 1); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	sarima_setCSSML(obj,0); // 0 - Only MLE , 1 - CSS + MLE
	//sarima_setOptMethod(obj, 7);// Method 5 ("BFGS") is default . The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	sarima_exec(obj, inp);
	sarima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
}